

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  string *psVar2;
  TestProperty *pTVar3;
  size_t sVar4;
  int i;
  char *__s;
  Message attributes;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  allocator<char> local_79;
  string local_78;
  string *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  Message::Message((Message *)&local_88);
  if (0 < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                       (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                             _vptr_TestEventListener) >> 6)) {
    i = 0;
    do {
      pTVar3 = TestResult::GetTestProperty((TestResult *)this,i);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_88.ptr_ + 0x10)," ",1);
      sVar1.ptr_ = local_88.ptr_;
      __s = (pTVar3->key_)._M_dataplus._M_p;
      if (__s == (char *)0x0) {
        sVar4 = 6;
        __s = "(null)";
      }
      else {
        sVar4 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(sVar1.ptr_ + 0x10),__s,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_88.ptr_ + 0x10),"=",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_88.ptr_ + 0x10),"\"",1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(pTVar3->value_)._M_dataplus._M_p,&local_79);
      EscapeXml(&local_78,&local_50,true);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),local_78._M_dataplus._M_p,
                 local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_88.ptr_ + 0x10),"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                              (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                                    _vptr_TestEventListener) >> 6));
  }
  psVar2 = local_58;
  StringStreamToString(local_58,local_88.ptr_);
  if (local_88.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_88.ptr_ + 8))();
  }
  return psVar2;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}